

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O0

bool ProduceSignature(SigningProvider *provider,BaseSignatureCreator *creator,CScript *fromPubKey,
                     SignatureData *sigdata)

{
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last_00;
  span<const_unsigned_char,_18446744073709551615UL> b;
  bool bVar1;
  Availability AVar2;
  CScript *__x;
  __shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2> *in_RCX;
  long *in_RSI;
  long in_FS_OFFSET;
  bool P2SH;
  bool solved;
  NodeRef<typename_WshSatisfier::Key> ms;
  TxoutType subType_1;
  TxoutType subType;
  SignatureData *in_stack_00000190;
  TxoutType whichType;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  result;
  TapSatisfier ms_satisfier;
  CScript witnessscript_1;
  CScript witnessscript;
  CScript subscript;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffffd68;
  __shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2> *this;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_fffffffffffffd70;
  SignatureData *in_stack_fffffffffffffd78;
  undefined6 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd86;
  undefined1 in_stack_fffffffffffffd87;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd98;
  opcodetype opcode;
  CScript *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  bool bVar3;
  iterator in_stack_fffffffffffffdb0;
  bool local_22b;
  bool local_229;
  bool local_211;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffffe00;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffffe08;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_00;
  CScript *in_stack_fffffffffffffe10;
  undefined6 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1e;
  undefined1 in_stack_fffffffffffffe1f;
  undefined8 in_stack_fffffffffffffe20;
  uint flags;
  CScriptWitness *in_stack_fffffffffffffe28;
  CScript *in_stack_fffffffffffffe30;
  CScript *in_stack_fffffffffffffe38;
  bool local_179;
  bool local_151;
  undefined8 in_stack_fffffffffffffeb0;
  SigVersion sigversion;
  TxoutType *in_stack_fffffffffffffeb8;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffffec0;
  CScript *in_stack_fffffffffffffec8;
  BaseSignatureCreator *in_stack_fffffffffffffed0;
  SigningProvider *in_stack_fffffffffffffed8;
  int local_ec;
  CScript local_e8 [4];
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_68;
  undefined1 local_48 [32];
  CScriptWitness local_28;
  long local_8;
  
  flags = (uint)((ulong)in_stack_fffffffffffffe20 >> 0x20);
  sigversion = (SigVersion)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  opcode = (opcodetype)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((((CScriptBase *)&in_RCX->_M_ptr)->_union).direct[0] & 1U) == 0) {
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::vector(in_stack_fffffffffffffd68);
    this = in_RCX;
    local_179 = SignStep(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                         in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                         in_stack_fffffffffffffeb8,sigversion,in_stack_00000190);
    bVar3 = false;
    CScript::CScript((CScript *)this);
    if ((local_179) && (local_ec == 4)) {
      in_stack_fffffffffffffe38 = (CScript *)0x0;
      in_stack_fffffffffffffe30 = local_e8;
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)in_stack_fffffffffffffd78,(size_type)in_stack_fffffffffffffd70);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd70)
      ;
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)in_stack_fffffffffffffd78,(size_type)in_stack_fffffffffffffd70);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd70)
      ;
      last._M_current._6_1_ = in_stack_fffffffffffffd86;
      last._M_current._0_6_ = in_stack_fffffffffffffd80;
      last._M_current._7_1_ = in_stack_fffffffffffffd87;
      CScript::
      CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ((CScript *)this,in_stack_fffffffffffffd88,last);
      in_stack_fffffffffffffe28 = &local_28;
      flags = (uint)((ulong)local_48 >> 0x20);
      CScript::operator=((CScript *)in_stack_fffffffffffffd78,(CScript *)in_stack_fffffffffffffd70);
      CScript::~CScript((CScript *)this);
      CScript::operator=((CScript *)in_stack_fffffffffffffd78,(CScript *)in_stack_fffffffffffffd70);
      if (local_179) {
        this = in_RCX;
        in_stack_fffffffffffffe1e =
             SignStep(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                      in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,sigversion,
                      in_stack_00000190);
      }
      in_stack_fffffffffffffe1f = false;
      bVar3 = true;
      local_179 = (bool)in_stack_fffffffffffffe1f;
    }
    if ((local_179 == false) || (local_ec != 8)) {
      if ((local_179 == false) || (local_ec != 7)) {
        if ((local_ec != 9) || (bVar3)) {
          if ((local_179 != false) && (local_ec == 10)) {
            (((CScriptBase *)&in_RCX->_M_ptr)->_union).direct[1] = '\x01';
          }
        }
        else {
          (((CScriptBase *)&in_RCX->_M_ptr)->_union).direct[1] = '\x01';
          if (local_179 != false) {
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator=((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)in_stack_fffffffffffffd78,
                        (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)in_stack_fffffffffffffd70);
          }
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::clear((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)this);
        }
      }
      else {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)in_stack_fffffffffffffd78,(size_type)in_stack_fffffffffffffd70);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffd70);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)in_stack_fffffffffffffd78,(size_type)in_stack_fffffffffffffd70);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffd70);
        last_00._M_current._6_1_ = in_stack_fffffffffffffd86;
        last_00._M_current._0_6_ = in_stack_fffffffffffffd80;
        last_00._M_current._7_1_ = in_stack_fffffffffffffd87;
        CScript::
        CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ((CScript *)this,in_stack_fffffffffffffd88,last_00);
        CScript::operator=((CScript *)in_stack_fffffffffffffd78,(CScript *)in_stack_fffffffffffffd70
                          );
        local_229 = false;
        if (local_179 != false) {
          this = in_RCX;
          bVar1 = SignStep(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                           in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                           in_stack_fffffffffffffeb8,sigversion,in_stack_00000190);
          local_229 = false;
          if (bVar1) {
            local_229 = true;
          }
        }
        local_179 = local_229;
        if ((local_229 == false) &&
           (bVar1 = std::
                    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::empty((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)in_stack_fffffffffffffd78), bVar1)) {
          WshSatisfier::WshSatisfier
                    ((TapSatisfier *)in_stack_fffffffffffffd88._M_current,
                     (SigningProvider *)
                     CONCAT17(in_stack_fffffffffffffd87,
                              CONCAT16(in_stack_fffffffffffffd86,in_stack_fffffffffffffd80)),
                     in_stack_fffffffffffffd78,(BaseSignatureCreator *)in_stack_fffffffffffffd70,
                     (CScript *)this);
          miniscript::FromScript<WshSatisfier>
                    ((CScript *)in_stack_fffffffffffffdb0.ptr,
                     (TapSatisfier *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
          bVar1 = std::__shared_ptr::operator_cast_to_bool(this);
          local_22b = false;
          if (bVar1) {
            std::
            __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
            AVar2 = miniscript::Node<CPubKey>::Satisfy<WshSatisfier>
                              ((Node<CPubKey> *)
                               CONCAT17(in_stack_fffffffffffffd87,
                                        CONCAT16(in_stack_fffffffffffffd86,in_stack_fffffffffffffd80
                                                )),(TapSatisfier *)in_stack_fffffffffffffd78,
                               (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)in_stack_fffffffffffffd70,SUB81((ulong)this >> 0x38,0));
            local_22b = AVar2 == YES;
          }
          local_179 = local_22b;
          std::shared_ptr<const_miniscript::Node<CPubKey>_>::~shared_ptr
                    ((shared_ptr<const_miniscript::Node<CPubKey>_> *)this);
        }
        prevector<28U,_unsigned_char,_unsigned_int,_int>::begin(in_stack_fffffffffffffd70);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::end(in_stack_fffffffffffffd70);
        std::
        vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
        ::
        emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
                  ((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)in_stack_fffffffffffffd88._M_current,
                   (iterator *)
                   CONCAT17(in_stack_fffffffffffffd87,
                            CONCAT16(in_stack_fffffffffffffd86,in_stack_fffffffffffffd80)),
                   (iterator *)in_stack_fffffffffffffd78);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator=(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
        (((CScriptBase *)&in_RCX->_M_ptr)->_union).direct[1] = '\x01';
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::clear((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)this);
        CScript::~CScript((CScript *)this);
      }
    }
    else {
      this_00 = &local_68;
      CScript::CScript((CScript *)this);
      in_stack_fffffffffffffe10 = CScript::operator<<(in_stack_fffffffffffffda0,opcode);
      __x = CScript::operator<<(in_stack_fffffffffffffda0,opcode);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)in_stack_fffffffffffffd78,(size_type)in_stack_fffffffffffffd70);
      ToByteVector<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
      std::span<const_unsigned_char,_18446744073709551615UL>::
      span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffd78,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd70)
      ;
      b._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffffda8;
      b._M_ptr = (pointer)in_stack_fffffffffffffda0;
      b._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffffdaf;
      CScript::operator<<((CScript *)in_stack_fffffffffffffd88._M_current,b);
      CScript::operator<<(in_stack_fffffffffffffda0,opcode);
      CScript::operator<<(in_stack_fffffffffffffda0,opcode);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd78)
      ;
      local_211 = false;
      if (local_179 != false) {
        this = in_RCX;
        local_211 = SignStep(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                             in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                             in_stack_fffffffffffffeb8,sigversion,in_stack_00000190);
      }
      local_179 = local_211;
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator=(this_00,(vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)__x);
      (((CScriptBase *)&in_RCX->_M_ptr)->_union).direct[1] = '\x01';
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::clear((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)this);
      CScript::~CScript((CScript *)this);
    }
    if (((((CScriptBase *)&in_RCX->_M_ptr)->_union).direct[1] & 1U) == 0) {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::clear((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)this);
    }
    if (bVar3) {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::begin(in_stack_fffffffffffffd70);
      in_stack_fffffffffffffdb0 =
           prevector<28U,_unsigned_char,_unsigned_int,_int>::end(in_stack_fffffffffffffd70);
      std::
      vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::
      emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
                ((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffd88._M_current,
                 (iterator *)
                 CONCAT17(in_stack_fffffffffffffd87,
                          CONCAT16(in_stack_fffffffffffffd86,in_stack_fffffffffffffd80)),
                 (iterator *)in_stack_fffffffffffffd78);
    }
    PushAll((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)in_stack_fffffffffffffdb0.ptr);
    CScript::operator=((CScript *)in_stack_fffffffffffffd78,(CScript *)in_stack_fffffffffffffd70);
    CScript::~CScript((CScript *)this);
    bVar3 = false;
    if (local_179 != false) {
      (**(code **)(*in_RSI + 0x10))();
      bVar3 = VerifyScript(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                           in_stack_fffffffffffffe28,flags,
                           (BaseSignatureChecker *)
                           CONCAT17(in_stack_fffffffffffffe1f,
                                    CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)),
                           (ScriptError *)in_stack_fffffffffffffe10);
    }
    (((CScriptBase *)&in_RCX->_M_ptr)->_union).direct[0] = bVar3;
    local_151 = (bool)((((CScriptBase *)&in_RCX->_M_ptr)->_union).direct[0] & 1);
    CScript::~CScript((CScript *)this);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)in_stack_fffffffffffffd78);
  }
  else {
    local_151 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_151;
  }
  __stack_chk_fail();
}

Assistant:

bool ProduceSignature(const SigningProvider& provider, const BaseSignatureCreator& creator, const CScript& fromPubKey, SignatureData& sigdata)
{
    if (sigdata.complete) return true;

    std::vector<valtype> result;
    TxoutType whichType;
    bool solved = SignStep(provider, creator, fromPubKey, result, whichType, SigVersion::BASE, sigdata);
    bool P2SH = false;
    CScript subscript;

    if (solved && whichType == TxoutType::SCRIPTHASH)
    {
        // Solver returns the subscript that needs to be evaluated;
        // the final scriptSig is the signatures from that
        // and then the serialized subscript:
        subscript = CScript(result[0].begin(), result[0].end());
        sigdata.redeem_script = subscript;
        solved = solved && SignStep(provider, creator, subscript, result, whichType, SigVersion::BASE, sigdata) && whichType != TxoutType::SCRIPTHASH;
        P2SH = true;
    }

    if (solved && whichType == TxoutType::WITNESS_V0_KEYHASH)
    {
        CScript witnessscript;
        witnessscript << OP_DUP << OP_HASH160 << ToByteVector(result[0]) << OP_EQUALVERIFY << OP_CHECKSIG;
        TxoutType subType;
        solved = solved && SignStep(provider, creator, witnessscript, result, subType, SigVersion::WITNESS_V0, sigdata);
        sigdata.scriptWitness.stack = result;
        sigdata.witness = true;
        result.clear();
    }
    else if (solved && whichType == TxoutType::WITNESS_V0_SCRIPTHASH)
    {
        CScript witnessscript(result[0].begin(), result[0].end());
        sigdata.witness_script = witnessscript;

        TxoutType subType{TxoutType::NONSTANDARD};
        solved = solved && SignStep(provider, creator, witnessscript, result, subType, SigVersion::WITNESS_V0, sigdata) && subType != TxoutType::SCRIPTHASH && subType != TxoutType::WITNESS_V0_SCRIPTHASH && subType != TxoutType::WITNESS_V0_KEYHASH;

        // If we couldn't find a solution with the legacy satisfier, try satisfying the script using Miniscript.
        // Note we need to check if the result stack is empty before, because it might be used even if the Script
        // isn't fully solved. For instance the CHECKMULTISIG satisfaction in SignStep() pushes partial signatures
        // and the extractor relies on this behaviour to combine witnesses.
        if (!solved && result.empty()) {
            WshSatisfier ms_satisfier{provider, sigdata, creator, witnessscript};
            const auto ms = miniscript::FromScript(witnessscript, ms_satisfier);
            solved = ms && ms->Satisfy(ms_satisfier, result) == miniscript::Availability::YES;
        }
        result.emplace_back(witnessscript.begin(), witnessscript.end());

        sigdata.scriptWitness.stack = result;
        sigdata.witness = true;
        result.clear();
    } else if (whichType == TxoutType::WITNESS_V1_TAPROOT && !P2SH) {
        sigdata.witness = true;
        if (solved) {
            sigdata.scriptWitness.stack = std::move(result);
        }
        result.clear();
    } else if (solved && whichType == TxoutType::WITNESS_UNKNOWN) {
        sigdata.witness = true;
    }

    if (!sigdata.witness) sigdata.scriptWitness.stack.clear();
    if (P2SH) {
        result.emplace_back(subscript.begin(), subscript.end());
    }
    sigdata.scriptSig = PushAll(result);

    // Test solution
    sigdata.complete = solved && VerifyScript(sigdata.scriptSig, fromPubKey, &sigdata.scriptWitness, STANDARD_SCRIPT_VERIFY_FLAGS, creator.Checker());
    return sigdata.complete;
}